

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::parseArgs(Context *this,int argc,char **argv,bool withDefaults)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  byte in_CL;
  char **in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  String strRes;
  int intRes;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  undefined1 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd31;
  undefined1 in_stack_fffffffffffffd32;
  undefined1 in_stack_fffffffffffffd33;
  undefined1 in_stack_fffffffffffffd34;
  undefined1 in_stack_fffffffffffffd35;
  undefined1 in_stack_fffffffffffffd36;
  undefined1 in_stack_fffffffffffffd37;
  undefined1 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd39;
  undefined1 in_stack_fffffffffffffd3a;
  undefined1 in_stack_fffffffffffffd3b;
  undefined1 in_stack_fffffffffffffd3c;
  undefined1 in_stack_fffffffffffffd3d;
  undefined1 in_stack_fffffffffffffd3e;
  undefined1 in_stack_fffffffffffffd3f;
  undefined1 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd41;
  undefined1 in_stack_fffffffffffffd42;
  undefined1 in_stack_fffffffffffffd43;
  undefined1 in_stack_fffffffffffffd44;
  undefined1 in_stack_fffffffffffffd45;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  undefined1 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd71;
  undefined1 in_stack_fffffffffffffd72;
  undefined1 in_stack_fffffffffffffd73;
  undefined1 in_stack_fffffffffffffd74;
  undefined1 in_stack_fffffffffffffd75;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  undefined1 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd79;
  undefined1 in_stack_fffffffffffffd7a;
  undefined1 in_stack_fffffffffffffd7b;
  undefined1 in_stack_fffffffffffffd7c;
  undefined1 in_stack_fffffffffffffd7d;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  int in_stack_fffffffffffffd84;
  int argc_00;
  byte local_256;
  byte local_236;
  char **res;
  size_type __n;
  optionType type;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar10;
  char **argv_00;
  int in_stack_fffffffffffffdf0;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  
  bVar1 = in_CL & 1;
  __n = 0;
  res = in_RDX;
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),0);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  uVar10 = in_ESI;
  argv_00 = in_RDX;
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),__n);
  type = (optionType)(__n >> 0x20);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),1);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),1);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),2);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),2);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),3);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),3);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),4);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),4);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),5);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),5);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),6);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),6);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),7);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),7);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),8);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::
  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ::operator[]((vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                *)(*in_RDI + 0x10b8),8);
  anon_unknown_14::parseCommaSepArgs
            (in_stack_ffffffffffffff40,
             (char **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(char *)in_RDX,
             (vector<doctest::String,_std::allocator<doctest::String>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffff28));
  String::String((String *)0x10c77b);
  bVar3 = false;
  String::String((String *)
                 CONCAT17(in_stack_fffffffffffffd47,
                          CONCAT16(in_stack_fffffffffffffd46,
                                   CONCAT15(in_stack_fffffffffffffd45,
                                            CONCAT14(in_stack_fffffffffffffd44,
                                                     CONCAT13(in_stack_fffffffffffffd43,
                                                              CONCAT12(in_stack_fffffffffffffd42,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))),
                 (char *)CONCAT17(in_stack_fffffffffffffd3f,
                                  CONCAT16(in_stack_fffffffffffffd3e,
                                           CONCAT15(in_stack_fffffffffffffd3d,
                                                    CONCAT14(in_stack_fffffffffffffd3c,
                                                             CONCAT13(in_stack_fffffffffffffd3b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))));
  bVar2 = anon_unknown_14::parseOption
                    (CONCAT13(in_stack_fffffffffffffd43,
                              CONCAT12(in_stack_fffffffffffffd42,
                                       CONCAT11(in_stack_fffffffffffffd41,in_stack_fffffffffffffd40)
                                      )),
                     (char **)CONCAT17(in_stack_fffffffffffffd3f,
                                       CONCAT16(in_stack_fffffffffffffd3e,
                                                CONCAT15(in_stack_fffffffffffffd3d,
                                                         CONCAT14(in_stack_fffffffffffffd3c,
                                                                  CONCAT13(in_stack_fffffffffffffd3b
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))),
                     (char *)CONCAT17(in_stack_fffffffffffffd37,
                                      CONCAT16(in_stack_fffffffffffffd36,
                                               CONCAT15(in_stack_fffffffffffffd35,
                                                        CONCAT14(in_stack_fffffffffffffd34,
                                                                 CONCAT13(in_stack_fffffffffffffd33,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffd32,
                                                  CONCAT11(in_stack_fffffffffffffd31,
                                                           in_stack_fffffffffffffd30))))))),
                     (String *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                     (String *)0x10c7e2);
  local_236 = 1;
  if (!bVar2) {
    String::String((String *)
                   CONCAT17(in_stack_fffffffffffffd47,
                            CONCAT16(in_stack_fffffffffffffd46,
                                     CONCAT15(in_stack_fffffffffffffd45,
                                              CONCAT14(in_stack_fffffffffffffd44,
                                                       CONCAT13(in_stack_fffffffffffffd43,
                                                                CONCAT12(in_stack_fffffffffffffd42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))),
                   (char *)CONCAT17(in_stack_fffffffffffffd3f,
                                    CONCAT16(in_stack_fffffffffffffd3e,
                                             CONCAT15(in_stack_fffffffffffffd3d,
                                                      CONCAT14(in_stack_fffffffffffffd3c,
                                                               CONCAT13(in_stack_fffffffffffffd3b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))));
    bVar3 = true;
    bVar2 = anon_unknown_14::parseOption
                      (CONCAT13(in_stack_fffffffffffffd43,
                                CONCAT12(in_stack_fffffffffffffd42,
                                         CONCAT11(in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))),
                       (char **)CONCAT17(in_stack_fffffffffffffd3f,
                                         CONCAT16(in_stack_fffffffffffffd3e,
                                                  CONCAT15(in_stack_fffffffffffffd3d,
                                                           CONCAT14(in_stack_fffffffffffffd3c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd3b,
                                                  CONCAT12(in_stack_fffffffffffffd3a,
                                                           CONCAT11(in_stack_fffffffffffffd39,
                                                                    in_stack_fffffffffffffd38)))))))
                       ,(char *)CONCAT17(in_stack_fffffffffffffd37,
                                         CONCAT16(in_stack_fffffffffffffd36,
                                                  CONCAT15(in_stack_fffffffffffffd35,
                                                           CONCAT14(in_stack_fffffffffffffd34,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd33,
                                                  CONCAT12(in_stack_fffffffffffffd32,
                                                           CONCAT11(in_stack_fffffffffffffd31,
                                                                    in_stack_fffffffffffffd30)))))))
                       ,(String *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                       (String *)0x10c86d);
    local_236 = 1;
    if (!bVar2) {
      local_236 = bVar1;
    }
  }
  if (bVar3) {
    String::~String((String *)
                    CONCAT17(in_stack_fffffffffffffd47,
                             CONCAT16(in_stack_fffffffffffffd46,
                                      CONCAT15(in_stack_fffffffffffffd45,
                                               CONCAT14(in_stack_fffffffffffffd44,
                                                        CONCAT13(in_stack_fffffffffffffd43,
                                                                 CONCAT12(in_stack_fffffffffffffd42,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))));
  }
  String::~String((String *)
                  CONCAT17(in_stack_fffffffffffffd47,
                           CONCAT16(in_stack_fffffffffffffd46,
                                    CONCAT15(in_stack_fffffffffffffd45,
                                             CONCAT14(in_stack_fffffffffffffd44,
                                                      CONCAT13(in_stack_fffffffffffffd43,
                                                               CONCAT12(in_stack_fffffffffffffd42,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))));
  if (local_236 != 0) {
    String::operator=((String *)
                      CONCAT17(in_stack_fffffffffffffd47,
                               CONCAT16(in_stack_fffffffffffffd46,
                                        CONCAT15(in_stack_fffffffffffffd45,
                                                 CONCAT14(in_stack_fffffffffffffd44,
                                                          CONCAT13(in_stack_fffffffffffffd43,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffd42,
                                                  CONCAT11(in_stack_fffffffffffffd41,
                                                           in_stack_fffffffffffffd40))))))),
                      (String *)
                      CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT15(in_stack_fffffffffffffd3d,
                                                 CONCAT14(in_stack_fffffffffffffd3c,
                                                          CONCAT13(in_stack_fffffffffffffd3b,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))));
  }
  bVar3 = false;
  String::String((String *)
                 CONCAT17(in_stack_fffffffffffffd47,
                          CONCAT16(in_stack_fffffffffffffd46,
                                   CONCAT15(in_stack_fffffffffffffd45,
                                            CONCAT14(in_stack_fffffffffffffd44,
                                                     CONCAT13(in_stack_fffffffffffffd43,
                                                              CONCAT12(in_stack_fffffffffffffd42,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))),
                 (char *)CONCAT17(in_stack_fffffffffffffd3f,
                                  CONCAT16(in_stack_fffffffffffffd3e,
                                           CONCAT15(in_stack_fffffffffffffd3d,
                                                    CONCAT14(in_stack_fffffffffffffd3c,
                                                             CONCAT13(in_stack_fffffffffffffd3b,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))));
  bVar2 = anon_unknown_14::parseOption
                    (CONCAT13(in_stack_fffffffffffffd43,
                              CONCAT12(in_stack_fffffffffffffd42,
                                       CONCAT11(in_stack_fffffffffffffd41,in_stack_fffffffffffffd40)
                                      )),
                     (char **)CONCAT17(in_stack_fffffffffffffd3f,
                                       CONCAT16(in_stack_fffffffffffffd3e,
                                                CONCAT15(in_stack_fffffffffffffd3d,
                                                         CONCAT14(in_stack_fffffffffffffd3c,
                                                                  CONCAT13(in_stack_fffffffffffffd3b
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))),
                     (char *)CONCAT17(in_stack_fffffffffffffd37,
                                      CONCAT16(in_stack_fffffffffffffd36,
                                               CONCAT15(in_stack_fffffffffffffd35,
                                                        CONCAT14(in_stack_fffffffffffffd34,
                                                                 CONCAT13(in_stack_fffffffffffffd33,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffd32,
                                                  CONCAT11(in_stack_fffffffffffffd31,
                                                           in_stack_fffffffffffffd30))))))),
                     (String *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                     (String *)0x10c9d6);
  local_256 = 1;
  if (!bVar2) {
    String::String((String *)
                   CONCAT17(in_stack_fffffffffffffd47,
                            CONCAT16(in_stack_fffffffffffffd46,
                                     CONCAT15(in_stack_fffffffffffffd45,
                                              CONCAT14(in_stack_fffffffffffffd44,
                                                       CONCAT13(in_stack_fffffffffffffd43,
                                                                CONCAT12(in_stack_fffffffffffffd42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))),
                   (char *)CONCAT17(in_stack_fffffffffffffd3f,
                                    CONCAT16(in_stack_fffffffffffffd3e,
                                             CONCAT15(in_stack_fffffffffffffd3d,
                                                      CONCAT14(in_stack_fffffffffffffd3c,
                                                               CONCAT13(in_stack_fffffffffffffd3b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))));
    bVar3 = true;
    bVar2 = anon_unknown_14::parseOption
                      (CONCAT13(in_stack_fffffffffffffd43,
                                CONCAT12(in_stack_fffffffffffffd42,
                                         CONCAT11(in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))),
                       (char **)CONCAT17(in_stack_fffffffffffffd3f,
                                         CONCAT16(in_stack_fffffffffffffd3e,
                                                  CONCAT15(in_stack_fffffffffffffd3d,
                                                           CONCAT14(in_stack_fffffffffffffd3c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd3b,
                                                  CONCAT12(in_stack_fffffffffffffd3a,
                                                           CONCAT11(in_stack_fffffffffffffd39,
                                                                    in_stack_fffffffffffffd38)))))))
                       ,(char *)CONCAT17(in_stack_fffffffffffffd37,
                                         CONCAT16(in_stack_fffffffffffffd36,
                                                  CONCAT15(in_stack_fffffffffffffd35,
                                                           CONCAT14(in_stack_fffffffffffffd34,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd33,
                                                  CONCAT12(in_stack_fffffffffffffd32,
                                                           CONCAT11(in_stack_fffffffffffffd31,
                                                                    in_stack_fffffffffffffd30)))))))
                       ,(String *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                       (String *)0x10ca55);
    local_256 = 1;
    if (!bVar2) {
      local_256 = bVar1;
    }
  }
  if (bVar3) {
    String::~String((String *)
                    CONCAT17(in_stack_fffffffffffffd47,
                             CONCAT16(in_stack_fffffffffffffd46,
                                      CONCAT15(in_stack_fffffffffffffd45,
                                               CONCAT14(in_stack_fffffffffffffd44,
                                                        CONCAT13(in_stack_fffffffffffffd43,
                                                                 CONCAT12(in_stack_fffffffffffffd42,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))));
  }
  String::~String((String *)
                  CONCAT17(in_stack_fffffffffffffd47,
                           CONCAT16(in_stack_fffffffffffffd46,
                                    CONCAT15(in_stack_fffffffffffffd45,
                                             CONCAT14(in_stack_fffffffffffffd44,
                                                      CONCAT13(in_stack_fffffffffffffd43,
                                                               CONCAT12(in_stack_fffffffffffffd42,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40))))))));
  if (local_256 != 0) {
    String::operator=((String *)
                      CONCAT17(in_stack_fffffffffffffd47,
                               CONCAT16(in_stack_fffffffffffffd46,
                                        CONCAT15(in_stack_fffffffffffffd45,
                                                 CONCAT14(in_stack_fffffffffffffd44,
                                                          CONCAT13(in_stack_fffffffffffffd43,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffd42,
                                                  CONCAT11(in_stack_fffffffffffffd41,
                                                           in_stack_fffffffffffffd40))))))),
                      (String *)
                      CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT15(in_stack_fffffffffffffd3d,
                                                 CONCAT14(in_stack_fffffffffffffd3c,
                                                          CONCAT13(in_stack_fffffffffffffd3b,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffd3a,
                                                  CONCAT11(in_stack_fffffffffffffd39,
                                                           in_stack_fffffffffffffd38))))))));
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined4 *)(*in_RDI + 0x58) = 0;
  }
  else if (bVar1 != 0) {
    *(undefined4 *)(*in_RDI + 0x58) = 0;
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined4 *)(*in_RDI + 0x5c) = 0;
  }
  else if (bVar1 != 0) {
    *(undefined4 *)(*in_RDI + 0x5c) = 0;
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined4 *)(*in_RDI + 0x60) = 0;
  }
  else if (bVar1 != 0) {
    *(undefined4 *)(*in_RDI + 0x60) = 0xffffffff;
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined4 *)(*in_RDI + 100) = 0;
  }
  else if (bVar1 != 0) {
    *(undefined4 *)(*in_RDI + 100) = 0;
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined4 *)(*in_RDI + 0x68) = 0;
  }
  else if (bVar1 != 0) {
    *(undefined4 *)(*in_RDI + 0x68) = 0x7fffffff;
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x6c) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (in_stack_fffffffffffffd84,
                       (char **)CONCAT17(in_stack_fffffffffffffd7f,
                                         CONCAT16(in_stack_fffffffffffffd7e,
                                                  CONCAT15(in_stack_fffffffffffffd7d,
                                                           CONCAT14(in_stack_fffffffffffffd7c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd7b,
                                                  CONCAT12(in_stack_fffffffffffffd7a,
                                                           CONCAT11(in_stack_fffffffffffffd79,
                                                                    in_stack_fffffffffffffd78)))))))
                       ,(char *)CONCAT17(in_stack_fffffffffffffd77,
                                         CONCAT16(in_stack_fffffffffffffd76,
                                                  CONCAT15(in_stack_fffffffffffffd75,
                                                           CONCAT14(in_stack_fffffffffffffd74,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                      );
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (in_stack_fffffffffffffd84,
                           (char **)CONCAT17(in_stack_fffffffffffffd7f,
                                             CONCAT16(in_stack_fffffffffffffd7e,
                                                      CONCAT15(in_stack_fffffffffffffd7d,
                                                               CONCAT14(in_stack_fffffffffffffd7c,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffd7b,
                                                  CONCAT12(in_stack_fffffffffffffd7a,
                                                           CONCAT11(in_stack_fffffffffffffd79,
                                                                    in_stack_fffffffffffffd78)))))))
                           ,(char *)CONCAT17(in_stack_fffffffffffffd77,
                                             CONCAT16(in_stack_fffffffffffffd76,
                                                      CONCAT15(in_stack_fffffffffffffd75,
                                                               CONCAT14(in_stack_fffffffffffffd74,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                          ), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x6c) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x6c) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x6d) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (in_stack_fffffffffffffd84,
                       (char **)CONCAT17(in_stack_fffffffffffffd7f,
                                         CONCAT16(in_stack_fffffffffffffd7e,
                                                  CONCAT15(in_stack_fffffffffffffd7d,
                                                           CONCAT14(in_stack_fffffffffffffd7c,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd7b,
                                                  CONCAT12(in_stack_fffffffffffffd7a,
                                                           CONCAT11(in_stack_fffffffffffffd79,
                                                                    in_stack_fffffffffffffd78)))))))
                       ,(char *)CONCAT17(in_stack_fffffffffffffd77,
                                         CONCAT16(in_stack_fffffffffffffd76,
                                                  CONCAT15(in_stack_fffffffffffffd75,
                                                           CONCAT14(in_stack_fffffffffffffd74,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                      );
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (in_stack_fffffffffffffd84,
                           (char **)CONCAT17(in_stack_fffffffffffffd7f,
                                             CONCAT16(in_stack_fffffffffffffd7e,
                                                      CONCAT15(in_stack_fffffffffffffd7d,
                                                               CONCAT14(in_stack_fffffffffffffd7c,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffd7b,
                                                  CONCAT12(in_stack_fffffffffffffd7a,
                                                           CONCAT11(in_stack_fffffffffffffd79,
                                                                    in_stack_fffffffffffffd78)))))))
                           ,(char *)CONCAT17(in_stack_fffffffffffffd77,
                                             CONCAT16(in_stack_fffffffffffffd76,
                                                      CONCAT15(in_stack_fffffffffffffd75,
                                                               CONCAT14(in_stack_fffffffffffffd74,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                          ), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x6d) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x6d) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  argc_00 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd84);
  if (!bVar3) {
    bVar3 = anon_unknown_14::parseIntOption
                      (in_stack_fffffffffffffdf0,argv_00,
                       (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
    argc_00 = CONCAT13((char)((uint)argc_00 >> 0x18),CONCAT12(bVar3,(short)argc_00));
    if (!bVar3) {
      bVar3 = anon_unknown_14::parseFlag
                        (argc_00,(char **)CONCAT17(in_stack_fffffffffffffd7f,
                                                   CONCAT16(in_stack_fffffffffffffd7e,
                                                            CONCAT15(in_stack_fffffffffffffd7d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(in_stack_fffffffffffffd7b,
                                                           CONCAT12(in_stack_fffffffffffffd7a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                         (char *)CONCAT17(in_stack_fffffffffffffd77,
                                          CONCAT16(in_stack_fffffffffffffd76,
                                                   CONCAT15(in_stack_fffffffffffffd75,
                                                            CONCAT14(in_stack_fffffffffffffd74,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                        );
      argc_00 = CONCAT22((short)((uint)argc_00 >> 0x10),CONCAT11(bVar3,(char)argc_00));
      if (!bVar3) {
        bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(in_stack_fffffffffffffd7f,
                                                     CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(in_stack_fffffffffffffd7b,
                                                           CONCAT12(in_stack_fffffffffffffd7a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(in_stack_fffffffffffffd77,
                                            CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                          );
        argc_00 = CONCAT31((int3)((uint)argc_00 >> 8),bVar3);
        if (!bVar3) {
          if (bVar1 != 0) {
            *(undefined1 *)(*in_RDI + 0x6e) = 0;
          }
          goto LAB_0010d195;
        }
      }
      *(undefined1 *)(*in_RDI + 0x6e) = 1;
      goto LAB_0010d195;
    }
  }
  *(undefined1 *)(*in_RDI + 0x6e) = 0;
LAB_0010d195:
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x6f) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(in_stack_fffffffffffffd7f,
                                                 CONCAT16(in_stack_fffffffffffffd7e,
                                                          CONCAT15(in_stack_fffffffffffffd7d,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(in_stack_fffffffffffffd7b,
                                                           CONCAT12(in_stack_fffffffffffffd7a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(in_stack_fffffffffffffd77,
                                        CONCAT16(in_stack_fffffffffffffd76,
                                                 CONCAT15(in_stack_fffffffffffffd75,
                                                          CONCAT14(in_stack_fffffffffffffd74,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                      );
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(in_stack_fffffffffffffd7f,
                                                     CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(in_stack_fffffffffffffd7b,
                                                           CONCAT12(in_stack_fffffffffffffd7a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(in_stack_fffffffffffffd77,
                                            CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                          ), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x6f) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x6f) = 0;
    }
  }
  uVar4 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if (((bool)uVar4) ||
     (in_stack_fffffffffffffd7e =
           anon_unknown_14::parseIntOption
                     (in_stack_fffffffffffffdf0,argv_00,
                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res),
     (bool)in_stack_fffffffffffffd7e)) {
    *(undefined1 *)(*in_RDI + 0x70) = 0;
  }
  else {
    in_stack_fffffffffffffd7d =
         anon_unknown_14::parseFlag
                   (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                             CONCAT15(in_stack_fffffffffffffd7d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(in_stack_fffffffffffffd7b,
                                                           CONCAT12(in_stack_fffffffffffffd7a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                    (char *)CONCAT17(in_stack_fffffffffffffd77,
                                     CONCAT16(in_stack_fffffffffffffd76,
                                              CONCAT15(in_stack_fffffffffffffd75,
                                                       CONCAT14(in_stack_fffffffffffffd74,
                                                                CONCAT13(in_stack_fffffffffffffd73,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if (((bool)in_stack_fffffffffffffd7d) ||
       (in_stack_fffffffffffffd7c =
             anon_unknown_14::parseFlag
                       (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                 CONCAT15(in_stack_fffffffffffffd7d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(in_stack_fffffffffffffd7b,
                                                           CONCAT12(in_stack_fffffffffffffd7a,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                        (char *)CONCAT17(in_stack_fffffffffffffd77,
                                         CONCAT16(in_stack_fffffffffffffd76,
                                                  CONCAT15(in_stack_fffffffffffffd75,
                                                           CONCAT14(in_stack_fffffffffffffd74,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                       ), (bool)in_stack_fffffffffffffd7c)) {
      *(undefined1 *)(*in_RDI + 0x70) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x70) = 0;
    }
  }
  uVar5 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if (((bool)uVar5) ||
     (in_stack_fffffffffffffd7a =
           anon_unknown_14::parseIntOption
                     (in_stack_fffffffffffffdf0,argv_00,
                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res),
     (bool)in_stack_fffffffffffffd7a)) {
    *(undefined1 *)(*in_RDI + 0x71) = 0;
  }
  else {
    in_stack_fffffffffffffd79 =
         anon_unknown_14::parseFlag
                   (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                             CONCAT15(in_stack_fffffffffffffd7d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                    (char *)CONCAT17(in_stack_fffffffffffffd77,
                                     CONCAT16(in_stack_fffffffffffffd76,
                                              CONCAT15(in_stack_fffffffffffffd75,
                                                       CONCAT14(in_stack_fffffffffffffd74,
                                                                CONCAT13(in_stack_fffffffffffffd73,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if (((bool)in_stack_fffffffffffffd79) ||
       (in_stack_fffffffffffffd78 =
             anon_unknown_14::parseFlag
                       (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                 CONCAT15(in_stack_fffffffffffffd7d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                        (char *)CONCAT17(in_stack_fffffffffffffd77,
                                         CONCAT16(in_stack_fffffffffffffd76,
                                                  CONCAT15(in_stack_fffffffffffffd75,
                                                           CONCAT14(in_stack_fffffffffffffd74,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                       ), (bool)in_stack_fffffffffffffd78)) {
      *(undefined1 *)(*in_RDI + 0x71) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x71) = 0;
    }
  }
  uVar6 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if (((bool)uVar6) ||
     (in_stack_fffffffffffffd76 =
           anon_unknown_14::parseIntOption
                     (in_stack_fffffffffffffdf0,argv_00,
                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res),
     (bool)in_stack_fffffffffffffd76)) {
    *(undefined1 *)(*in_RDI + 0x72) = 0;
  }
  else {
    in_stack_fffffffffffffd75 =
         anon_unknown_14::parseFlag
                   (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                             CONCAT15(in_stack_fffffffffffffd7d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                    (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                    CONCAT15(in_stack_fffffffffffffd75,
                                                             CONCAT14(in_stack_fffffffffffffd74,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                   );
    if (((bool)in_stack_fffffffffffffd75) ||
       (in_stack_fffffffffffffd74 =
             anon_unknown_14::parseFlag
                       (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                 CONCAT15(in_stack_fffffffffffffd7d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                        (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                        CONCAT15(in_stack_fffffffffffffd75,
                                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffd73,
                                                  CONCAT12(in_stack_fffffffffffffd72,
                                                           CONCAT11(in_stack_fffffffffffffd71,
                                                                    in_stack_fffffffffffffd70)))))))
                       ), (bool)in_stack_fffffffffffffd74)) {
      *(undefined1 *)(*in_RDI + 0x72) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x72) = 0;
    }
  }
  uVar7 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if (((bool)uVar7) ||
     (in_stack_fffffffffffffd72 =
           anon_unknown_14::parseIntOption
                     (in_stack_fffffffffffffdf0,argv_00,
                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res),
     (bool)in_stack_fffffffffffffd72)) {
    *(undefined1 *)(*in_RDI + 0x73) = 0;
  }
  else {
    in_stack_fffffffffffffd71 =
         anon_unknown_14::parseFlag
                   (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                             CONCAT15(in_stack_fffffffffffffd7d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                    (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                    CONCAT15(in_stack_fffffffffffffd75,
                                                             CONCAT14(in_stack_fffffffffffffd74,
                                                                      CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if (((bool)in_stack_fffffffffffffd71) ||
       (in_stack_fffffffffffffd70 =
             anon_unknown_14::parseFlag
                       (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                 CONCAT15(in_stack_fffffffffffffd7d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                        (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                        CONCAT15(in_stack_fffffffffffffd75,
                                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                                          CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))),
       (bool)in_stack_fffffffffffffd70)) {
      *(undefined1 *)(*in_RDI + 0x73) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x73) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x74) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x74) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x74) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x75) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x75) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x75) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x76) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x76) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x76) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x77) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x77) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x77) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x78) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x78) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x78) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x79) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x79) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x79) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x7a) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x7a) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x7a) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x7b) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x7b) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x7b) = 1;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x7c) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x7c) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x7c) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x7d) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x7d) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x7d) = 0;
    }
  }
  uVar8 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if (((bool)uVar8) ||
     (in_stack_fffffffffffffd46 =
           anon_unknown_14::parseIntOption
                     (in_stack_fffffffffffffdf0,argv_00,
                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res),
     (bool)in_stack_fffffffffffffd46)) {
    *(undefined1 *)(*in_RDI + 0x7e) = 0;
  }
  else {
    in_stack_fffffffffffffd45 =
         anon_unknown_14::parseFlag
                   (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                             CONCAT15(in_stack_fffffffffffffd7d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                    (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                    CONCAT15(in_stack_fffffffffffffd75,
                                                             CONCAT14(in_stack_fffffffffffffd74,
                                                                      CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if (((bool)in_stack_fffffffffffffd45) ||
       (in_stack_fffffffffffffd44 =
             anon_unknown_14::parseFlag
                       (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                 CONCAT15(in_stack_fffffffffffffd7d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                        (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                        CONCAT15(in_stack_fffffffffffffd75,
                                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                                          CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))),
       (bool)in_stack_fffffffffffffd44)) {
      *(undefined1 *)(*in_RDI + 0x7e) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x7e) = 0;
    }
  }
  uVar9 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if (((bool)uVar9) ||
     (in_stack_fffffffffffffd42 =
           anon_unknown_14::parseIntOption
                     (in_stack_fffffffffffffdf0,argv_00,
                      (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res),
     (bool)in_stack_fffffffffffffd42)) {
    *(undefined1 *)(*in_RDI + 0x7f) = 0;
  }
  else {
    in_stack_fffffffffffffd41 =
         anon_unknown_14::parseFlag
                   (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                             CONCAT15(in_stack_fffffffffffffd7d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                    (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                    CONCAT15(in_stack_fffffffffffffd75,
                                                             CONCAT14(in_stack_fffffffffffffd74,
                                                                      CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if (((bool)in_stack_fffffffffffffd41) ||
       (in_stack_fffffffffffffd40 =
             anon_unknown_14::parseFlag
                       (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                 CONCAT15(in_stack_fffffffffffffd7d,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                        (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                        CONCAT15(in_stack_fffffffffffffd75,
                                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                                          CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))),
       (bool)in_stack_fffffffffffffd40)) {
      *(undefined1 *)(*in_RDI + 0x7f) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x7f) = 0;
    }
  }
  bVar3 = anon_unknown_14::parseIntOption
                    (in_stack_fffffffffffffdf0,argv_00,
                     (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res);
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseIntOption
                        (in_stack_fffffffffffffdf0,argv_00,
                         (char *)CONCAT44(uVar10,in_stack_fffffffffffffde0),type,(int *)res), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x80) = 0;
  }
  else {
    bVar3 = anon_unknown_14::parseFlag
                      (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                CONCAT15(in_stack_fffffffffffffd7d,
                                                                         CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                       (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                       CONCAT15(in_stack_fffffffffffffd75,
                                                                CONCAT14(in_stack_fffffffffffffd74,
                                                                         CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
    if ((bVar3) ||
       (bVar3 = anon_unknown_14::parseFlag
                          (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                           (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                           CONCAT15(in_stack_fffffffffffffd75,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) {
      *(undefined1 *)(*in_RDI + 0x80) = 1;
    }
    else if (bVar1 != 0) {
      *(undefined1 *)(*in_RDI + 0x80) = 0;
    }
  }
  if (bVar1 != 0) {
    *(undefined1 *)(*in_RDI + 0x81) = 0;
    *(undefined1 *)(*in_RDI + 0x82) = 0;
    *(undefined1 *)(*in_RDI + 0x83) = 0;
    *(undefined1 *)(*in_RDI + 0x84) = 0;
    *(undefined1 *)(*in_RDI + 0x85) = 0;
    *(undefined1 *)(*in_RDI + 0x86) = 0;
  }
  bVar3 = anon_unknown_14::parseFlag
                    (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                     (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
  if (((bVar3) ||
      (bVar3 = anon_unknown_14::parseFlag
                         (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffd7d,
                                                  CONCAT14(in_stack_fffffffffffffd7c,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffd7a,
                                                  CONCAT11(in_stack_fffffffffffffd79,
                                                           in_stack_fffffffffffffd78))))))),
                          (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                          CONCAT15(in_stack_fffffffffffffd75,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffd74,
                                                  CONCAT13(uVar7,CONCAT12(in_stack_fffffffffffffd72,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd71,
                                                  in_stack_fffffffffffffd70)))))))), bVar3)) ||
     (bVar3 = anon_unknown_14::parseFlag
                        (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                  CONCAT15(in_stack_fffffffffffffd7d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                         (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                         CONCAT15(in_stack_fffffffffffffd75,
                                                                  CONCAT14(in_stack_fffffffffffffd74
                                                                           ,CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x81) = 1;
    *(undefined1 *)(*in_RDI + 0x6e) = 1;
  }
  bVar3 = anon_unknown_14::parseFlag
                    (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                     (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseFlag
                        (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                  CONCAT15(in_stack_fffffffffffffd7d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                         (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                         CONCAT15(in_stack_fffffffffffffd75,
                                                                  CONCAT14(in_stack_fffffffffffffd74
                                                                           ,CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x82) = 1;
    *(undefined1 *)(*in_RDI + 0x6e) = 1;
  }
  bVar3 = anon_unknown_14::parseFlag
                    (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                     (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseFlag
                        (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                  CONCAT15(in_stack_fffffffffffffd7d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                         (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                         CONCAT15(in_stack_fffffffffffffd75,
                                                                  CONCAT14(in_stack_fffffffffffffd74
                                                                           ,CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x83) = 1;
    *(undefined1 *)(*in_RDI + 0x6e) = 1;
  }
  bVar3 = anon_unknown_14::parseFlag
                    (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                     (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseFlag
                        (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                  CONCAT15(in_stack_fffffffffffffd7d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                         (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                         CONCAT15(in_stack_fffffffffffffd75,
                                                                  CONCAT14(in_stack_fffffffffffffd74
                                                                           ,CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x84) = 1;
    *(undefined1 *)(*in_RDI + 0x6e) = 1;
  }
  bVar3 = anon_unknown_14::parseFlag
                    (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                     (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseFlag
                        (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                  CONCAT15(in_stack_fffffffffffffd7d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                         (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                         CONCAT15(in_stack_fffffffffffffd75,
                                                                  CONCAT14(in_stack_fffffffffffffd74
                                                                           ,CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x85) = 1;
    *(undefined1 *)(*in_RDI + 0x6e) = 1;
  }
  bVar3 = anon_unknown_14::parseFlag
                    (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                              CONCAT15(in_stack_fffffffffffffd7d,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                     (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                     CONCAT15(in_stack_fffffffffffffd75,
                                                              CONCAT14(in_stack_fffffffffffffd74,
                                                                       CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70))))))));
  if ((bVar3) ||
     (bVar3 = anon_unknown_14::parseFlag
                        (argc_00,(char **)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd7e,
                                                                  CONCAT15(in_stack_fffffffffffffd7d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffd7c,
                                                  CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffffd7a,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))),
                         (char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffd76,
                                                         CONCAT15(in_stack_fffffffffffffd75,
                                                                  CONCAT14(in_stack_fffffffffffffd74
                                                                           ,CONCAT13(uVar7,CONCAT12(
                                                  in_stack_fffffffffffffd72,
                                                  CONCAT11(in_stack_fffffffffffffd71,
                                                           in_stack_fffffffffffffd70)))))))), bVar3)
     ) {
    *(undefined1 *)(*in_RDI + 0x86) = 1;
    *(undefined1 *)(*in_RDI + 0x6e) = 1;
  }
  String::~String((String *)
                  CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffd46,
                                          CONCAT15(in_stack_fffffffffffffd45,
                                                   CONCAT14(in_stack_fffffffffffffd44,
                                                            CONCAT13(uVar9,CONCAT12(
                                                  in_stack_fffffffffffffd42,
                                                  CONCAT11(in_stack_fffffffffffffd41,
                                                           in_stack_fffffffffffffd40))))))));
  return;
}

Assistant:

void Context::parseArgs(int argc, const char* const* argv, bool withDefaults) {
    using namespace detail;

    // clang-format off
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "source-file=",        p->filters[0]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sf=",                 p->filters[0]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "source-file-exclude=",p->filters[1]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sfe=",                p->filters[1]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-suite=",         p->filters[2]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "ts=",                 p->filters[2]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-suite-exclude=", p->filters[3]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tse=",                p->filters[3]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-case=",          p->filters[4]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tc=",                 p->filters[4]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-case-exclude=",  p->filters[5]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tce=",                p->filters[5]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "subcase=",            p->filters[6]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sc=",                 p->filters[6]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "subcase-exclude=",    p->filters[7]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sce=",                p->filters[7]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "reporters=",          p->filters[8]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "r=",                  p->filters[8]);
    // clang-format on

    int    intRes = 0;
    String strRes;

#define DOCTEST_PARSE_AS_BOOL_OR_FLAG(name, sname, var, default)                                   \
    if(parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", option_bool, intRes) ||  \
       parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", option_bool, intRes))   \
        p->var = static_cast<bool>(intRes);                                                        \
    else if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name) ||                           \
            parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname))                            \
        p->var = true;                                                                             \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_INT_OPTION(name, sname, var, default)                                        \
    if(parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", option_int, intRes) ||   \
       parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", option_int, intRes))    \
        p->var = intRes;                                                                           \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_STR_OPTION(name, sname, var, default)                                        \
    if(parseOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", &strRes, default) ||        \
       parseOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", &strRes, default) ||       \
       withDefaults)                                                                               \
    p->var = strRes

    // clang-format off
    DOCTEST_PARSE_STR_OPTION("out", "o", out, "");
    DOCTEST_PARSE_STR_OPTION("order-by", "ob", order_by, "file");
    DOCTEST_PARSE_INT_OPTION("rand-seed", "rs", rand_seed, 0);

    DOCTEST_PARSE_INT_OPTION("first", "f", first, 0);
    DOCTEST_PARSE_INT_OPTION("last", "l", last, UINT_MAX);

    DOCTEST_PARSE_INT_OPTION("abort-after", "aa", abort_after, 0);
    DOCTEST_PARSE_INT_OPTION("subcase-filter-levels", "scfl", subcase_filter_levels, INT_MAX);

    DOCTEST_PARSE_AS_BOOL_OR_FLAG("success", "s", success, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("case-sensitive", "cs", case_sensitive, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("exit", "e", exit, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("duration", "d", duration, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("minimal", "m", minimal, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("quiet", "q", quiet, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-throw", "nt", no_throw, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-exitcode", "ne", no_exitcode, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-run", "nr", no_run, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-intro", "ni", no_intro, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-version", "nv", no_version, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-colors", "nc", no_colors, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("force-colors", "fc", force_colors, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-breaks", "nb", no_breaks, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-skip", "ns", no_skip, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("gnu-file-line", "gfl", gnu_file_line, !bool(DOCTEST_MSVC));
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-path-filenames", "npf", no_path_in_filenames, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-line-numbers", "nln", no_line_numbers, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-debug-output", "ndo", no_debug_output, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-skipped-summary", "nss", no_skipped_summary, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-time-in-output", "ntio", no_time_in_output, false);
    // clang-format on

    if(withDefaults) {
        p->help             = false;
        p->version          = false;
        p->count            = false;
        p->list_test_cases  = false;
        p->list_test_suites = false;
        p->list_reporters   = false;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "help") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "h") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "?")) {
        p->help = true;
        p->exit = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "version") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "v")) {
        p->version = true;
        p->exit    = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "count") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "c")) {
        p->count = true;
        p->exit  = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-test-cases") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "ltc")) {
        p->list_test_cases = true;
        p->exit            = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-test-suites") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "lts")) {
        p->list_test_suites = true;
        p->exit             = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-reporters") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "lr")) {
        p->list_reporters = true;
        p->exit           = true;
    }
}